

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar *k;
  FILE *__stream;
  AES_KEY *key_00;
  char *__s;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  uint uVar8;
  uint uVar10;
  undefined1 auVar9 [16];
  block input;
  int n;
  AES_KEY key;
  char filename [1001];
  int local_4dc;
  AES_KEY local_4d8;
  char local_418 [1016];
  
  dpf_seed((block *)0x0);
  local_4d8.rd_key[0][0] = _DAT_00103030;
  local_4d8.rd_key[0][1] = _UNK_00103038;
  auVar6 = aeskeygenassist((undefined1  [16])_DAT_00103030,1);
  uVar7 = auVar6._12_4_;
  auVar9._4_4_ = uVar7;
  auVar9._0_4_ = uVar7;
  auVar9._8_4_ = uVar7;
  auVar9._12_4_ = uVar7;
  local_4d8.rd_key[1] = (block)(auVar9 ^ _DAT_00103040);
  auVar6 = aeskeygenassist((undefined1  [16])local_4d8.rd_key[1],2);
  uVar8 = (uint)local_4d8.rd_key[1][0];
  uVar10 = (uint)local_4d8.rd_key[1][1] ^ local_4d8.rd_key[1][0]._4_4_;
  local_4d8.rd_key[2][1]._4_4_ = auVar6._12_4_;
  local_4d8.rd_key[2][0]._0_4_ = uVar8 ^ local_4d8.rd_key[2][1]._4_4_;
  local_4d8.rd_key[2][0]._4_4_ = uVar8 ^ local_4d8.rd_key[1][0]._4_4_ ^ local_4d8.rd_key[2][1]._4_4_
  ;
  local_4d8.rd_key[2][1]._0_4_ = uVar8 ^ uVar10 ^ local_4d8.rd_key[2][1]._4_4_;
  local_4d8.rd_key[2][1]._4_4_ =
       uVar10 ^ local_4d8.rd_key[1][1]._4_4_ ^ uVar8 ^ local_4d8.rd_key[2][1]._4_4_;
  auVar6._4_4_ = local_4d8.rd_key[2][0]._4_4_;
  auVar6._0_4_ = (uint)local_4d8.rd_key[2][0];
  auVar6._8_4_ = (uint)local_4d8.rd_key[2][1];
  auVar6._12_4_ = local_4d8.rd_key[2][1]._4_4_;
  auVar6 = aeskeygenassist(auVar6,4);
  uVar8 = auVar6._12_4_;
  local_4d8.rd_key[3][0]._0_4_ = (uint)local_4d8.rd_key[2][0] ^ uVar8;
  local_4d8.rd_key[3][0]._4_4_ = (uint)local_4d8.rd_key[2][0] ^ local_4d8.rd_key[2][0]._4_4_ ^ uVar8
  ;
  local_4d8.rd_key[3][1]._0_4_ =
       (uint)local_4d8.rd_key[2][0] ^ (uint)local_4d8.rd_key[2][1] ^ local_4d8.rd_key[2][0]._4_4_ ^
       uVar8;
  local_4d8.rd_key[3][1]._4_4_ =
       (uint)local_4d8.rd_key[2][1] ^ local_4d8.rd_key[2][0]._4_4_ ^
       local_4d8.rd_key[2][1]._4_4_ ^ (uint)local_4d8.rd_key[2][0] ^ uVar8;
  auVar6 = aeskeygenassist((undefined1  [16])local_4d8.rd_key[3],8);
  local_4d8.rd_key[4][1]._4_4_ = auVar6._12_4_;
  local_4d8.rd_key[4][0]._0_4_ = (uint)local_4d8.rd_key[3][0] ^ local_4d8.rd_key[4][1]._4_4_;
  local_4d8.rd_key[4][0]._4_4_ =
       (uint)local_4d8.rd_key[3][0] ^ local_4d8.rd_key[3][0]._4_4_ ^ local_4d8.rd_key[4][1]._4_4_;
  local_4d8.rd_key[4][1]._0_4_ =
       (uint)local_4d8.rd_key[3][0] ^ (uint)local_4d8.rd_key[3][1] ^ local_4d8.rd_key[3][0]._4_4_ ^
       local_4d8.rd_key[4][1]._4_4_;
  local_4d8.rd_key[4][1]._4_4_ =
       (uint)local_4d8.rd_key[3][1] ^ local_4d8.rd_key[3][0]._4_4_ ^
       local_4d8.rd_key[3][1]._4_4_ ^ (uint)local_4d8.rd_key[3][0] ^ local_4d8.rd_key[4][1]._4_4_;
  auVar1._4_4_ = local_4d8.rd_key[4][0]._4_4_;
  auVar1._0_4_ = (uint)local_4d8.rd_key[4][0];
  auVar1._8_4_ = (uint)local_4d8.rd_key[4][1];
  auVar1._12_4_ = local_4d8.rd_key[4][1]._4_4_;
  auVar6 = aeskeygenassist(auVar1,0x10);
  uVar8 = auVar6._12_4_;
  local_4d8.rd_key[5][0]._0_4_ = (uint)local_4d8.rd_key[4][0] ^ uVar8;
  local_4d8.rd_key[5][0]._4_4_ = (uint)local_4d8.rd_key[4][0] ^ local_4d8.rd_key[4][0]._4_4_ ^ uVar8
  ;
  local_4d8.rd_key[5][1]._0_4_ =
       (uint)local_4d8.rd_key[4][0] ^ (uint)local_4d8.rd_key[4][1] ^ local_4d8.rd_key[4][0]._4_4_ ^
       uVar8;
  local_4d8.rd_key[5][1]._4_4_ =
       (uint)local_4d8.rd_key[4][1] ^ local_4d8.rd_key[4][0]._4_4_ ^
       local_4d8.rd_key[4][1]._4_4_ ^ (uint)local_4d8.rd_key[4][0] ^ uVar8;
  auVar6 = aeskeygenassist((undefined1  [16])local_4d8.rd_key[5],0x20);
  local_4d8.rd_key[6][1]._4_4_ = auVar6._12_4_;
  local_4d8.rd_key[6][0]._0_4_ = (uint)local_4d8.rd_key[5][0] ^ local_4d8.rd_key[6][1]._4_4_;
  local_4d8.rd_key[6][0]._4_4_ =
       (uint)local_4d8.rd_key[5][0] ^ local_4d8.rd_key[5][0]._4_4_ ^ local_4d8.rd_key[6][1]._4_4_;
  local_4d8.rd_key[6][1]._0_4_ =
       (uint)local_4d8.rd_key[5][0] ^ (uint)local_4d8.rd_key[5][1] ^ local_4d8.rd_key[5][0]._4_4_ ^
       local_4d8.rd_key[6][1]._4_4_;
  local_4d8.rd_key[6][1]._4_4_ =
       (uint)local_4d8.rd_key[5][1] ^ local_4d8.rd_key[5][0]._4_4_ ^
       local_4d8.rd_key[5][1]._4_4_ ^ (uint)local_4d8.rd_key[5][0] ^ local_4d8.rd_key[6][1]._4_4_;
  auVar2._4_4_ = local_4d8.rd_key[6][0]._4_4_;
  auVar2._0_4_ = (uint)local_4d8.rd_key[6][0];
  auVar2._8_4_ = (uint)local_4d8.rd_key[6][1];
  auVar2._12_4_ = local_4d8.rd_key[6][1]._4_4_;
  auVar6 = aeskeygenassist(auVar2,0x40);
  uVar8 = auVar6._12_4_;
  local_4d8.rd_key[7][0]._0_4_ = (uint)local_4d8.rd_key[6][0] ^ uVar8;
  local_4d8.rd_key[7][0]._4_4_ = (uint)local_4d8.rd_key[6][0] ^ local_4d8.rd_key[6][0]._4_4_ ^ uVar8
  ;
  local_4d8.rd_key[7][1]._0_4_ =
       (uint)local_4d8.rd_key[6][0] ^ (uint)local_4d8.rd_key[6][1] ^ local_4d8.rd_key[6][0]._4_4_ ^
       uVar8;
  local_4d8.rd_key[7][1]._4_4_ =
       (uint)local_4d8.rd_key[6][1] ^ local_4d8.rd_key[6][0]._4_4_ ^
       local_4d8.rd_key[6][1]._4_4_ ^ (uint)local_4d8.rd_key[6][0] ^ uVar8;
  auVar6 = aeskeygenassist((undefined1  [16])local_4d8.rd_key[7],0x80);
  local_4d8.rd_key[8][1]._4_4_ = auVar6._12_4_;
  local_4d8.rd_key[8][0]._0_4_ = (uint)local_4d8.rd_key[7][0] ^ local_4d8.rd_key[8][1]._4_4_;
  local_4d8.rd_key[8][0]._4_4_ =
       (uint)local_4d8.rd_key[7][0] ^ local_4d8.rd_key[7][0]._4_4_ ^ local_4d8.rd_key[8][1]._4_4_;
  local_4d8.rd_key[8][1]._0_4_ =
       (uint)local_4d8.rd_key[7][0] ^ (uint)local_4d8.rd_key[7][1] ^ local_4d8.rd_key[7][0]._4_4_ ^
       local_4d8.rd_key[8][1]._4_4_;
  local_4d8.rd_key[8][1]._4_4_ =
       (uint)local_4d8.rd_key[7][1] ^ local_4d8.rd_key[7][0]._4_4_ ^
       local_4d8.rd_key[7][1]._4_4_ ^ (uint)local_4d8.rd_key[7][0] ^ local_4d8.rd_key[8][1]._4_4_;
  auVar3._4_4_ = local_4d8.rd_key[8][0]._4_4_;
  auVar3._0_4_ = (uint)local_4d8.rd_key[8][0];
  auVar3._8_4_ = (uint)local_4d8.rd_key[8][1];
  auVar3._12_4_ = local_4d8.rd_key[8][1]._4_4_;
  auVar6 = aeskeygenassist(auVar3,0x1b);
  uVar8 = auVar6._12_4_;
  local_4d8.rd_key[9][0]._0_4_ = (uint)local_4d8.rd_key[8][0] ^ uVar8;
  local_4d8.rd_key[9][0]._4_4_ = (uint)local_4d8.rd_key[8][0] ^ local_4d8.rd_key[8][0]._4_4_ ^ uVar8
  ;
  local_4d8.rd_key[9][1]._0_4_ =
       (uint)local_4d8.rd_key[8][0] ^ (uint)local_4d8.rd_key[8][1] ^ local_4d8.rd_key[8][0]._4_4_ ^
       uVar8;
  local_4d8.rd_key[9][1]._4_4_ =
       (uint)local_4d8.rd_key[8][1] ^ local_4d8.rd_key[8][0]._4_4_ ^
       local_4d8.rd_key[8][1]._4_4_ ^ (uint)local_4d8.rd_key[8][0] ^ uVar8;
  auVar6 = aeskeygenassist((undefined1  [16])local_4d8.rd_key[9],0x36);
  local_4d8.rd_key[10][1]._4_4_ = auVar6._12_4_;
  local_4d8.rd_key[10][0]._0_4_ = (uint)local_4d8.rd_key[9][0] ^ local_4d8.rd_key[10][1]._4_4_;
  local_4d8.rd_key[10][0]._4_4_ =
       (uint)local_4d8.rd_key[9][0] ^ local_4d8.rd_key[9][0]._4_4_ ^ local_4d8.rd_key[10][1]._4_4_;
  local_4d8.rd_key[10][1]._0_4_ =
       (uint)local_4d8.rd_key[9][0] ^ (uint)local_4d8.rd_key[9][1] ^ local_4d8.rd_key[9][0]._4_4_ ^
       local_4d8.rd_key[10][1]._4_4_;
  local_4d8.rd_key[10][1]._4_4_ =
       (uint)local_4d8.rd_key[9][1] ^ local_4d8.rd_key[9][0]._4_4_ ^
       local_4d8.rd_key[9][1]._4_4_ ^ (uint)local_4d8.rd_key[9][0] ^ local_4d8.rd_key[10][1]._4_4_;
  local_4d8.rounds = 10;
  if (argc == 3) {
    __isoc99_sscanf(argv[1],"%d",&local_4dc);
    __isoc99_sscanf(argv[2],"%s",local_418);
    k = (uchar *)malloc((long)(local_4dc * 0x12 + -0x5c));
    if (k == (uchar *)0x0) {
      __s = "Failed to allocate a memory space.";
    }
    else {
      __stream = fopen(local_418,"rb");
      if (__stream != (FILE *)0x0) {
        fread(k,(long)(local_4dc * 0x12 + -0x5c),1,__stream);
        fclose(__stream);
        key_00 = &local_4d8;
        EVALFULL(key_00,k);
        uVar5 = 1L << ((byte)local_4dc & 0x3f);
        if (0x7f < (int)uVar5) {
          uVar4 = 0;
          do {
            input[1] = (longlong)k;
            input[0] = (longlong)key_00;
            dpf_cbnotnewline(input);
            uVar4 = uVar4 + 0x10;
          } while ((uVar5 >> 3 & 0xfffffffffffffff0) != uVar4);
        }
        return 0;
      }
      __s = "Failed to open the file.";
    }
  }
  else {
    __s = "format: fsseval N filename";
  }
  puts(__s);
  exit(0);
}

Assistant:

int main(int argc, char** argv){
	long long userkey1 = 597349; long long userkey2 = 121379; 
	block userkey = dpf_make_block(userkey1, userkey2);

	dpf_seed(NULL);

	AES_KEY key;
	AES_set_encrypt_key(userkey, &key);

	if(argc != 3){
		printf("format: fsseval N filename\n");
		exit(0);
	}

	int n;
	char filename[1001];
	sscanf(argv[1], "%d", &n);
	sscanf(argv[2], "%s", filename);

	unsigned char *k = (unsigned char*) malloc(getsize(n));

	if(k == NULL){
		printf("Failed to allocate a memory space.\n");
		exit(0);
	}

	FILE *fp = fopen(filename, "rb");

	if(fp == NULL){
		printf("Failed to open the file.\n");
		exit(0);
	}

	fread(k, getsize(n), 1, fp);
	fclose(fp);

	block *resf;
	resf = EVALFULL(&key, k);

	int j;
	int totalblocknumber = (1 << n) / 128;
	for(j = 0; j < totalblocknumber; j++){
		dpf_cbnotnewline(resf[j]);
	}

	return 0;
}